

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O2

Formula * Kernel::Formula::createITE(Formula *condition,Formula *thenArg,Formula *elseArg)

{
  TermList TVar1;
  TermList elseBranch;
  TermList branchSort;
  BoolTermFormula *this;
  
  TVar1._content = (uint64_t)Term::createFormula(thenArg);
  elseBranch._content = (uint64_t)Term::createFormula(elseArg);
  branchSort = AtomicSort::boolSort();
  TVar1._content = (uint64_t)Term::createITE(condition,TVar1,elseBranch,branchSort);
  this = (BoolTermFormula *)BoolTermFormula::operator_new(0x30);
  BoolTermFormula::BoolTermFormula(this,TVar1);
  return &this->super_Formula;
}

Assistant:

Formula* Formula::createITE(Formula* condition, Formula* thenArg, Formula* elseArg)
{
  TermList thenTerm(Term::createFormula(thenArg));
  TermList elseTerm(Term::createFormula(elseArg));
  TermList iteTerm(Term::createITE(condition, thenTerm, elseTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(iteTerm);
}